

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.h
# Opt level: O0

void __thiscall
llvm::MCSuperRegIterator::MCSuperRegIterator
          (MCSuperRegIterator *this,MCRegister Reg,MCRegisterInfo *MCRI,bool IncludeSelf)

{
  uint uVar1;
  bool IncludeSelf_local;
  MCRegisterInfo *MCRI_local;
  MCSuperRegIterator *this_local;
  MCRegister Reg_local;
  
  this_local._4_4_ = Reg.Reg;
  MCRegisterInfo::DiffListIterator::DiffListIterator(&this->super_DiffListIterator);
  uVar1 = MCRegister::operator_cast_to_unsigned_int((MCRegister *)((long)&this_local + 4));
  MCRegisterInfo::get(MCRI,this_local._4_4_);
  MCRegisterInfo::DiffListIterator::init
            (&this->super_DiffListIterator,(EVP_PKEY_CTX *)(ulong)(ushort)uVar1);
  if (!IncludeSelf) {
    MCRegisterInfo::DiffListIterator::operator++(&this->super_DiffListIterator);
  }
  return;
}

Assistant:

MCSuperRegIterator(MCRegister Reg, const MCRegisterInfo *MCRI,
                     bool IncludeSelf = false) {
    init(Reg, MCRI->DiffLists + MCRI->get(Reg).SuperRegs);
    // Initially, the iterator points to Reg itself.
    if (!IncludeSelf)
      ++*this;
  }